

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

string * __thiscall
SimpleLogger::getLogFilePath_abi_cxx11_
          (string *__return_storage_ptr__,SimpleLogger *this,size_t file_num)

{
  size_type *psVar1;
  ulong uVar2;
  pointer pcVar3;
  bool bVar4;
  undefined8 uVar5;
  char cVar6;
  undefined8 *puVar7;
  size_t sVar8;
  char cVar9;
  ulong uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_60;
  uint local_58;
  undefined4 uStack_54;
  ulong local_50 [2];
  ulong *local_40;
  long local_38;
  ulong local_30 [2];
  
  if (file_num == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (this->filePath)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (this->filePath)._M_string_length);
    return __return_storage_ptr__;
  }
  pcVar3 = (this->filePath)._M_dataplus._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar3,pcVar3 + (this->filePath)._M_string_length);
  std::__cxx11::string::append((char *)&local_40);
  cVar9 = '\x01';
  if (9 < file_num) {
    sVar8 = file_num;
    cVar6 = '\x04';
    do {
      cVar9 = cVar6;
      if (sVar8 < 100) {
        cVar9 = cVar9 + -2;
        goto LAB_00109232;
      }
      if (sVar8 < 1000) {
        cVar9 = cVar9 + -1;
        goto LAB_00109232;
      }
      if (sVar8 < 10000) goto LAB_00109232;
      bVar4 = 99999 < sVar8;
      sVar8 = sVar8 / 10000;
      cVar6 = cVar9 + '\x04';
    } while (bVar4);
    cVar9 = cVar9 + '\x01';
  }
LAB_00109232:
  local_60 = local_50;
  std::__cxx11::string::_M_construct((ulong)&local_60,cVar9);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_60,local_58,file_num);
  uVar2 = CONCAT44(uStack_54,local_58) + local_38;
  uVar10 = 0xf;
  if (local_40 != local_30) {
    uVar10 = local_30[0];
  }
  if (uVar10 < uVar2) {
    uVar10 = 0xf;
    if (local_60 != local_50) {
      uVar10 = local_50[0];
    }
    if (uVar2 <= uVar10) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_40);
      goto LAB_001092b4;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_60);
LAB_001092b4:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar1) {
    uVar5 = puVar7[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SimpleLogger::getLogFilePath(size_t file_num) const {
    if (file_num) {
        return filePath + "." + std::to_string(file_num);
    }
    return filePath;
}